

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simple_object_pool.h
# Opt level: O3

pointer __thiscall
Gudhi::
Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,false,false,true>>>>
::construct<unsigned_int&,unsigned_int&>
          (Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,false,false,true>>>>
           *this,uint *u,uint *u_1)

{
  ID_index IVar1;
  void *ret;
  pointer pEVar2;
  
  pEVar2 = *(pointer *)this;
  if (pEVar2 == (pointer)0x0) {
    pEVar2 = (pointer)boost::pool<boost::default_user_allocator_malloc_free>::malloc_need_resize
                                ((pool<boost::default_user_allocator_malloc_free> *)this);
    if (pEVar2 == (pointer)0x0) {
      __assert_fail("p",
                    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/common/include/gudhi/Simple_object_pool.h"
                    ,0x33,
                    "pointer Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, true, false, false, false, true>>>>::construct(U &&...) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, true, false, false, false, true>>>, U = <unsigned int &, unsigned int &>]"
                   );
    }
  }
  else {
    *(undefined8 *)this = *(undefined8 *)pEVar2;
  }
  IVar1 = *u_1;
  (pEVar2->super_Entry_column_index_option).columnIndex_ = *u;
  (pEVar2->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
  (pEVar2->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
  pEVar2->rowIndex_ = IVar1;
  return pEVar2;
}

Assistant:

pointer construct(U&&...u) {
    void* p = base().malloc BOOST_PREVENT_MACRO_SUBSTITUTION();
    assert(p);
    try {
      new(p) T(std::forward<U>(u)...);
    }    catch (...) {
      base().free BOOST_PREVENT_MACRO_SUBSTITUTION(p);
      throw;
    }
    return static_cast<pointer> (p);
  }